

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

SyntaxKind slang::syntax::SyntaxFacts::getKeywordNameExpression(TokenKind kind)

{
  TokenKind kind_local;
  undefined4 local_4;
  
  if (kind == AndKeyword) {
    local_4 = ArrayAndMethod;
  }
  else if (kind == LocalKeyword) {
    local_4 = LocalScope;
  }
  else if (kind == NewKeyword) {
    local_4 = ConstructorName;
  }
  else if (kind == OrKeyword) {
    local_4 = ArrayOrMethod;
  }
  else if (kind == SuperKeyword) {
    local_4 = SuperHandle;
  }
  else if (kind == ThisKeyword) {
    local_4 = ThisHandle;
  }
  else if (kind == UniqueKeyword) {
    local_4 = ArrayUniqueMethod;
  }
  else if (kind == XorKeyword) {
    local_4 = ArrayXorMethod;
  }
  else if (kind == UnitSystemName) {
    local_4 = UnitScope;
  }
  else if (kind == RootSystemName) {
    local_4 = RootScope;
  }
  else {
    local_4 = Unknown;
  }
  return local_4;
}

Assistant:

SyntaxKind SyntaxFacts::getKeywordNameExpression(TokenKind kind) {
    switch (kind) {
        case TokenKind::UnitSystemName: return SyntaxKind::UnitScope;
        case TokenKind::RootSystemName: return SyntaxKind::RootScope;
        case TokenKind::LocalKeyword: return SyntaxKind::LocalScope;
        case TokenKind::ThisKeyword: return SyntaxKind::ThisHandle;
        case TokenKind::SuperKeyword: return SyntaxKind::SuperHandle;
        case TokenKind::UniqueKeyword: return SyntaxKind::ArrayUniqueMethod;
        case TokenKind::AndKeyword: return SyntaxKind::ArrayAndMethod;
        case TokenKind::OrKeyword: return SyntaxKind::ArrayOrMethod;
        case TokenKind::XorKeyword: return SyntaxKind::ArrayXorMethod;
        case TokenKind::NewKeyword: return SyntaxKind::ConstructorName;
        default: return SyntaxKind::Unknown;
    }
}